

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

uo_cb * uo_cb_create(void)

{
  uo_linklist *puVar1;
  uo_cb_linklist *puVar2;
  size_t in_RSI;
  
  puVar2 = uo_cb_linkpool_rent();
  uo_stack_create_at(&(puVar2->item).stack,in_RSI);
  puVar1 = &(puVar2->item).funclist;
  (puVar2->item).funclist.prev = puVar1;
  (puVar2->item).funclist.next = puVar1;
  return &puVar2->item;
}

Assistant:

uo_cb *uo_cb_create()
{
    uo_cb *cb = &uo_cb_linkpool_rent()->item;
    uo_stack_create_at(&cb->stack, 0);
    uo_linklist_selflink(&cb->funclist);

    return cb;
}